

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-mpq.c
# Opt level: O3

void mpq_div(__mpq_struct *r,__mpq_struct *a,__mpq_struct *b)

{
  mpq_t t;
  __mpq_struct local_28;
  
  local_28._mp_num._mp_size = (b->_mp_den)._mp_size;
  local_28._mp_num._mp_d = (b->_mp_den)._mp_d;
  local_28._mp_den._mp_size = (b->_mp_num)._mp_size;
  local_28._mp_den._mp_d = (b->_mp_num)._mp_d;
  local_28._mp_num._mp_alloc = 0;
  local_28._mp_den._mp_alloc = 0;
  mpq_mul(r,a,&local_28);
  return;
}

Assistant:

void
mpq_div (mpq_t r, const mpq_t a, const mpq_t b)
{
  mpq_t t;
  mpq_mul (r, a, mpq_roinit_zz (t, mpq_denref (b), mpq_numref (b)));
}